

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *st;
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  jpeg_error_mgr *pjVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var14;
  int local_58;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar11 = *(int *)((long)&pjVar2[4].start_pass + 4);
    if (iVar11 == 0) {
      process_restart(cinfo);
      iVar11 = *(int *)((long)&pjVar2[4].start_pass + 4);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = iVar11 + -1;
  }
  if ((*(int *)&pjVar2[2].start_pass != -1) && (iVar11 = cinfo->Ss, iVar11 <= cinfo->Se)) {
    piVar3 = cinfo->natural_order;
    paJVar4 = *MCU_data;
    iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
    do {
      p_Var14 = (&pjVar2[0xc].decode_mcu)[iVar1];
      lVar13 = (long)(iVar11 * 3 + -3);
      iVar6 = arith_decode(cinfo,(uchar *)(p_Var14 + lVar13));
      if (iVar6 != 0) {
        return 1;
      }
      p_Var14 = p_Var14 + lVar13 + 2;
      lVar13 = 0;
      while (iVar6 = arith_decode(cinfo,(uchar *)(p_Var14 + -1)), iVar6 == 0) {
        p_Var14 = p_Var14 + 3;
        lVar13 = lVar13 + 1;
        if (cinfo->Se <= iVar11 + -1 + (int)lVar13) goto LAB_001150d5;
      }
      iVar6 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
      iVar7 = arith_decode(cinfo,(uchar *)p_Var14);
      local_58 = iVar11 + (int)lVar13;
      if (iVar7 == 0) {
        uVar12 = 0;
      }
      else {
        iVar7 = arith_decode(cinfo,(uchar *)p_Var14);
        if (iVar7 == 0) {
          uVar12 = 1;
        }
        else {
          p_Var14 = (&pjVar2[0xc].decode_mcu)[iVar1];
          lVar10 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[iVar1] < local_58) {
            lVar10 = 0xd9;
          }
          st = p_Var14 + lVar10;
          iVar7 = arith_decode(cinfo,(uchar *)st);
          if (iVar7 == 0) {
            p_Var14 = st + 0xe;
            uVar12 = 2;
            uVar9 = uVar12;
          }
          else {
            p_Var14 = p_Var14 + lVar10 + 0xe;
            uVar12 = 2;
            do {
              uVar12 = uVar12 * 2;
              if (uVar12 == 0x8000) {
LAB_001150d5:
                pjVar5 = cinfo->err;
                pjVar5->msg_code = 0x75;
                (*pjVar5->emit_message)((j_common_ptr)cinfo,-1);
                *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
                return 1;
              }
              iVar7 = arith_decode(cinfo,(uchar *)(p_Var14 + -0xd));
              p_Var14 = p_Var14 + 1;
            } while (iVar7 != 0);
            uVar9 = uVar12;
            if (uVar12 == 0) {
              uVar12 = 0;
              goto LAB_00115084;
            }
          }
          do {
            uVar9 = (int)uVar9 >> 1;
            uVar8 = arith_decode(cinfo,(uchar *)p_Var14);
            if (uVar8 != 0) {
              uVar8 = uVar9;
            }
            uVar12 = uVar12 | uVar8;
          } while (1 < uVar9);
        }
      }
LAB_00115084:
      uVar9 = ~uVar12;
      if (iVar6 == 0) {
        uVar9 = uVar12 + 1;
      }
      (*paJVar4)[piVar3[iVar11 + lVar13]] = (JCOEF)(uVar9 << ((byte)cinfo->Al & 0x1f));
      iVar11 = iVar11 + (int)lVar13 + 1;
    } while (local_58 < cinfo->Se);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;		/* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
	m <<= 1;
	st = entropy->ac_stats[tbl] +
	     (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1; if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[natural_order[k]] = (JCOEF) (v << cinfo->Al);
  }

  return TRUE;
}